

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForAllHelp::~CallForAllHelp(CallForAllHelp *this)

{
  void *in_RDI;
  
  ~CallForAllHelp((CallForAllHelp *)0x174a48);
  operator_delete(in_RDI);
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}